

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize.cpp
# Opt level: O2

VkGraphicsPipelineCreateInfo * __thiscall
Fossilize::StateRecorder::Impl::copy<VkGraphicsPipelineCreateInfo>
          (Impl *this,VkGraphicsPipelineCreateInfo *src,size_t count,ScratchAllocator *alloc)

{
  VkGraphicsPipelineCreateInfo *pVVar1;
  
  if (count != 0) {
    pVVar1 = ScratchAllocator::allocate_n<VkGraphicsPipelineCreateInfo>(alloc,count);
    if (pVVar1 != (VkGraphicsPipelineCreateInfo *)0x0) {
      pVVar1 = (VkGraphicsPipelineCreateInfo *)memmove(pVVar1,src,count * 0x90);
      return pVVar1;
    }
  }
  return (VkGraphicsPipelineCreateInfo *)0x0;
}

Assistant:

T *StateRecorder::Impl::copy(const T *src, size_t count, ScratchAllocator &alloc)
{
	if (!count)
		return nullptr;

	auto *new_data = alloc.allocate_n<T>(count);
	if (new_data)
		std::copy(src, src + count, new_data);
	return new_data;
}